

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void i_number_suite::run(void)

{
  i_number_double_huge_neg_exp();
  i_number_huge_exp();
  i_number_neg_int_huge_exp();
  i_number_pos_double_huge_exp();
  i_number_real_neg_overflow();
  i_number_real_pos_overflow();
  i_number_too_big_neg_int();
  i_number_too_big_pos_int();
  i_number_very_big_negative_int();
  return;
}

Assistant:

void run()
{
    i_number_double_huge_neg_exp();
    i_number_huge_exp();
    i_number_neg_int_huge_exp();
    i_number_pos_double_huge_exp();
    i_number_real_neg_overflow();
    i_number_real_pos_overflow();
    i_number_too_big_neg_int();
    i_number_too_big_pos_int();
    i_number_very_big_negative_int();
}